

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O1

void __thiscall
so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t::
no_activity_tracking_impl_t(no_activity_tracking_impl_t *this,lock_unique_ptr_t *lock)

{
  lock_t *plVar1;
  
  plVar1 = (lock->_M_t).
           super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  (lock->_M_t).
  super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
       (lock_t *)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->super_common_data_t).m_demands.
  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::
  _M_initialize_map((_Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
                     *)this,0);
  (this->super_common_data_t).m_lock._M_t.
  super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl = plVar1;
  (this->super_common_data_t).m_in_service = false;
  return;
}

Assistant:

no_activity_tracking_impl_t(
		queue_traits::lock_unique_ptr_t lock )
		:	common_data_t( std::move(lock) )
	{}